

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

int AF_DObject_S_ChangeMusic
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FString music;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_00323f92:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                  ,0xa35,
                  "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x02') {
    pcVar3 = "param[paramnum].Type == REGT_STRING";
    goto LAB_00323f92;
  }
  FString::AttachToOther(&music,(FString *)param);
  if (numparam == 1) {
    if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_00324033;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
LAB_00324033:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0xa36,
                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (2 < (uint)numparam) {
      if (param[2].field_0.field_3.Type == '\0') {
        if (numparam == 3) {
          pcVar3 = "(paramnum) < numparam";
        }
        else {
          if (param[3].field_0.field_3.Type == '\0') {
            bVar1 = S_ChangeMusic(music.Chars,param[1].field_0.i,param[2].field_0.i != 0,
                                  param[3].field_0.i != 0);
            if (numret < 1) {
              iVar2 = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                              ,0xa39,
                              "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetInt(ret,(uint)bVar1);
              iVar2 = 1;
            }
            FString::~FString(&music);
            return iVar2;
          }
          pcVar3 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                      ,0xa38,
                      "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar3 = "param[paramnum].Type == REGT_INT";
      goto LAB_00323fcd;
    }
  }
  pcVar3 = "(paramnum) < numparam";
LAB_00323fcd:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                ,0xa37,
                "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, S_ChangeMusic)
{
	PARAM_PROLOGUE;
	PARAM_STRING(music);
	PARAM_INT_DEF(order);
	PARAM_BOOL(looping);
	PARAM_BOOL(force);
	ACTION_RETURN_BOOL(S_ChangeMusic(music, order, looping, force));
}